

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabCloseMethod(sqlite3_vtab_cursor *pCursor)

{
  sqlite3_stmt *in_RDI;
  Fts5VocabCursor *pCsr;
  
  fts5VocabResetCursor((Fts5VocabCursor *)0x294591);
  sqlite3Fts5BufferFree((Fts5Buffer *)0x29459f);
  sqlite3_finalize(in_RDI);
  sqlite3_free((void *)0x2945b7);
  return 0;
}

Assistant:

static int fts5VocabCloseMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  fts5VocabResetCursor(pCsr);
  sqlite3Fts5BufferFree(&pCsr->term);
  sqlite3_finalize(pCsr->pStmt);
  sqlite3_free(pCsr);
  return SQLITE_OK;
}